

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputCaseLabel(Node *this,ostream *os)

{
  ostream *poVar1;
  string sStack_58;
  string local_38;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputCaseLabel(this->Tree[0],os);
  }
  Indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(os,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"case ");
  Expression_abi_cxx11_(&sStack_58,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_58);
  poVar1 = std::operator<<(poVar1,":");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Node::OutputCaseLabel(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	//
	// Handle this if it is a list
	//
	if (Type == BAS_N_LIST)
	{
		Tree[0]->OutputCaseLabel(os);
		Tree[1]->OutputCaseLabel(os);
		return;
	}

	//
	// Output one case statement
	//
	os << Indent() << "case " << Expression() << ":" << std::endl;
}